

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vehicle.cpp
# Opt level: O1

bool __thiscall Car::ok_time(Car *this,Node a,double **matrix)

{
  int iVar1;
  bool bVar2;
  
  iVar1 = (int)matrix[this->now_idx][a.idx] / this->car_speed + this->now_time;
  if ((iVar1 < a.tw_open) || (bVar2 = true, a.tw_close < iVar1 + a.unload_time)) {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool Car::ok_time(Node a, double** matrix) const
{
	int travel_time = (int)matrix[now_idx][a.idx] / car_speed;
	int arrival_time = now_time + travel_time;
	if(a.tw_open <= arrival_time && arrival_time + a.unload_time <= a.tw_close){
		return true;// arrive after opening && leave before closing
	}
	else{
		return false;
	}
}